

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

uint __thiscall Gluco::Solver::computeLBD(Solver *this,Clause *c)

{
  VarData *pVVar1;
  uint *puVar2;
  uint uVar3;
  int i;
  long lVar4;
  int nbDone;
  uint uVar5;
  int iVar6;
  
  this->MYFLAG = this->MYFLAG + 1;
  if (this->incremental == 0) {
    pVVar1 = (this->vardata).data;
    puVar2 = (this->permDiff).data;
    uVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)&(c->header).field_0x4; lVar4 = lVar4 + 1) {
      iVar6 = pVVar1[*(int *)(&c[1].header.field_0x0 + lVar4 * 4) >> 1].level;
      if (puVar2[iVar6] != this->MYFLAG) {
        puVar2[iVar6] = this->MYFLAG;
        uVar3 = uVar3 + 1;
      }
    }
  }
  else {
    pVVar1 = (this->vardata).data;
    puVar2 = (this->permDiff).data;
    lVar4 = 0;
    uVar5 = 0;
    uVar3 = 0;
    while ((lVar4 < *(int *)&(c->header).field_0x4 && (uVar5 < *(uint *)&(c->header).field_0x8))) {
      iVar6 = *(int *)(&c[1].header.field_0x0 + lVar4 * 4) >> 1;
      if ((this->incremental == 0) || (iVar6 <= this->nbVarsInitialFormula)) {
        uVar5 = uVar5 + 1;
        iVar6 = pVVar1[iVar6].level;
        if (puVar2[iVar6] != this->MYFLAG) {
          puVar2[iVar6] = this->MYFLAG;
          uVar3 = uVar3 + 1;
        }
      }
      lVar4 = lVar4 + 1;
    }
  }
  return uVar3;
}

Assistant:

inline unsigned int Solver::computeLBD(const Clause &c) {
  int nblevels = 0;
  MYFLAG++;

  if(incremental) { // ----------------- INCREMENTAL MODE
     int nbDone = 0;
    for(int i=0;i<c.size();i++) {
      if(nbDone>=c.sizeWithoutSelectors()) break;
      if(isSelector(var(c[i]))) continue;
      nbDone++;
      int l = level(var(c[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  } else { // -------- DEFAULT MODE. NOT A LOT OF DIFFERENCES... BUT EASIER TO READ
    for(int i=0;i<c.size();i++) {
      int l = level(var(c[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  }
  return nblevels;
}